

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_linpart.cpp
# Opt level: O2

LO Omega_h::linear_partition_size(GO total,I32 comm_size,I32 comm_rank)

{
  return (int)(total / (long)comm_size) + (uint)(comm_rank < (int)(total % (long)comm_size));
}

Assistant:

LO linear_partition_size(GO total, I32 comm_size, I32 comm_rank) {
  auto const comm_size_gt = GO(comm_size);
  auto const quot = total / comm_size_gt;
  auto const rem = total % comm_size_gt;
  if (comm_rank < static_cast<I32>(rem))
    return static_cast<LO>(quot + 1);
  else
    return static_cast<LO>(quot);
}